

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall flow::lang::ASTNode::~ASTNode(ASTNode *this)

{
  code *pcVar1;
  ASTNode *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ASTNode() {}